

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O1

void __thiscall SStringView_RBegin_Test::~SStringView_RBegin_Test(SStringView_RBegin_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SStringView, RBegin) {
    std::string const src{"abc"};
    using sv_type = pstore::sstring_view<char const *>;
    sv_type sv = pstore::make_sstring_view (src.data (), src.length ());
    sv_type const & csv = sv;

    sv_type::reverse_iterator rbegin = sv.rbegin ();
    sv_type::const_reverse_iterator const_begin1 = csv.rbegin ();
    sv_type::const_reverse_iterator const_begin2 = sv.crbegin ();

    std::size_t const last = sv.size () - 1;
    EXPECT_EQ (*rbegin, sv[last]);
    EXPECT_EQ (&*rbegin, &sv[last]);
    EXPECT_EQ (*const_begin1, sv[last]);
    EXPECT_EQ (&*const_begin1, &sv[last]);
    EXPECT_EQ (*const_begin2, sv[last]);
    EXPECT_EQ (&*const_begin2, &sv[last]);

    EXPECT_EQ (rbegin, const_begin1);
    EXPECT_EQ (rbegin, const_begin2);
    EXPECT_EQ (const_begin1, const_begin2);
}